

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dothrow.c
# Opt level: O0

int hero_breaks(obj *obj,xchar x,xchar y,boolean from_invent)

{
  boolean bVar1;
  bool local_1e;
  byte local_1d;
  boolean in_view;
  boolean from_invent_local;
  xchar y_local;
  xchar x_local;
  obj *obj_local;
  
  if ((u.uprops[0x1e].intrinsic != 0) ||
     (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
      (local_1d = 0, ((youmonst.data)->mflags1 & 0x1000) != 0)))) {
    local_1e = false;
    if (ublindf != (obj *)0x0) {
      local_1e = ublindf->oartifact == '\x1d';
    }
    local_1d = local_1e ^ 0xff;
  }
  bVar1 = breaktest(obj);
  if (bVar1 != '\0') {
    breakmsg(obj,(local_1d ^ 0xff) & 1);
    breakobj(obj,x,y,'\x01',from_invent);
  }
  obj_local._4_4_ = (uint)(bVar1 != '\0');
  return obj_local._4_4_;
}

Assistant:

int hero_breaks(struct obj *obj,
		xchar x, xchar y, /* object location (ox, oy may not be right) */
		boolean from_invent) /* thrown or dropped by player; maybe on shop bill */
{
	boolean in_view = !Blind;
	if (!breaktest(obj)) return 0;
	breakmsg(obj, in_view);
	breakobj(obj, x, y, TRUE, from_invent);
	return 1;
}